

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

compute_mul_parity_result
fmt::v11::detail::dragonbox::cache_accessor<double>::compute_mul_parity
          (carrier_uint two_f,cache_entry_type *cache,int beta)

{
  byte bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int in_EDX;
  uint64_t unaff_retaddr;
  uint128_fallback in_stack_00000008;
  uint128_fallback r;
  uint128_fallback local_30;
  bool local_1e;
  bool local_1d;
  int local_1c;
  compute_mul_parity_result local_2;
  
  local_1d = 0 < in_EDX;
  local_1c = in_EDX;
  ignore_unused<bool,char[1]>(&local_1d,(char (*) [1])0x7198a0);
  local_1e = local_1c < 0x40;
  ignore_unused<bool,char[1]>(&local_1e,(char (*) [1])0x7198a0);
  local_30 = umul192_lower128(unaff_retaddr,in_stack_00000008);
  uVar2 = uint128_fallback::high(&local_30);
  local_2.parity = (uVar2 >> (0x40 - (byte)local_1c & 0x3f) & 1) != 0;
  uVar2 = uint128_fallback::high(&local_30);
  bVar1 = (byte)local_1c & 0x3f;
  uVar3 = uint128_fallback::low(&local_30);
  local_2.is_integer = uVar2 << bVar1 == 0 && uVar3 >> (0x40 - (byte)local_1c & 0x3f) == 0;
  return local_2;
}

Assistant:

static auto compute_mul_parity(carrier_uint two_f,
                                 const cache_entry_type& cache,
                                 int beta) noexcept
      -> compute_mul_parity_result {
    FMT_ASSERT(beta >= 1, "");
    FMT_ASSERT(beta < 64, "");

    auto r = umul192_lower128(two_f, cache);
    return {((r.high() >> (64 - beta)) & 1) != 0,
            ((r.high() << beta) | (r.low() >> (64 - beta))) == 0};
  }